

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O1

char ** apprun_shell_split_arguments(char *str)

{
  _Bool _Var1;
  size_t sVar2;
  char **ppcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  ulong uVar6;
  byte bVar7;
  byte *itr;
  bool bVar8;
  char buffer [1024];
  char acStack_438 [1032];
  
  if (str == (char *)0x0) {
    ppcVar3 = (char **)0x0;
  }
  else {
    sVar2 = strlen(str);
    ppcVar3 = (char **)calloc(sVar2 + 1,8);
    uVar6 = 0;
    memset(acStack_438,0,0x400);
    bVar7 = *str;
    while (bVar7 != 0) {
      bVar7 = *str;
      itr = (byte *)str;
      if (bVar7 != 0) {
        ppuVar4 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar4 + (long)(char)bVar7 * 2 + 1) & 0x20) == 0) break;
          bVar7 = itr[1];
          itr = itr + 1;
        } while (bVar7 != 0);
      }
      bVar8 = *itr == 0x5c;
      if (bVar8) {
        strncat(acStack_438,(char *)(itr + 1),1);
        str = (char *)(itr + 2);
      }
      else if (*itr == 0x27) {
        pcVar5 = apprun_string_consume_until((char *)(itr + 1),"\'");
        strncat(acStack_438,(char *)(itr + 1),(size_t)(pcVar5 + ~(ulong)itr));
        str = pcVar5 + 1;
        bVar8 = true;
      }
      if ((!bVar8) && (*itr == 0x22)) {
        pcVar5 = apprun_string_consume_until((char *)(itr + 1),"\"");
        strncat(acStack_438,(char *)(itr + 1),(size_t)(pcVar5 + ~(ulong)itr));
        str = pcVar5 + 1;
        bVar8 = true;
      }
      if ((!bVar8) &&
         ((0x3a < *itr - 0x22 || ((0x400000000000021U >> ((ulong)(*itr - 0x22) & 0x3f) & 1) == 0))))
      {
        str = apprun_string_consume_until((char *)itr,"\"\'\\ \t");
        strncat(acStack_438,(char *)itr,(long)str - (long)itr);
      }
      ppuVar4 = __ctype_b_loc();
      if (((long)*str == 0) || (((*ppuVar4)[*str] & 0x2000) != 0)) {
        _Var1 = apprun_string_is_all_blanks(acStack_438);
        if (!_Var1) {
          pcVar5 = apprun_string_trim(acStack_438);
          ppcVar3[uVar6] = pcVar5;
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        memset(acStack_438,0,0x400);
      }
      bVar7 = *str;
    }
  }
  return ppcVar3;
}

Assistant:

char **apprun_shell_split_arguments(char const *str) {
    if (str == NULL)
        return NULL;

    static const char single_quote_delimiter[] = "\'";
    static const char double_quote_delimiter[] = "\"";
    static const char regular_quote_delimiter[] = "\"\'\\ \t";

    char **splits = calloc(strlen(str) + 1, sizeof(char *));
    unsigned split_count = 0;

    const char *begin = str;
    const char *end = str;
    char buffer[1024] = {0x0};

    while (*begin != '\0') {
        begin = apprun_string_consume_spaces(begin);
        bool consumed = false;

        if (*begin == '\\') {
            strncat(buffer, begin + 1, 1);
            end = begin + 2;
            consumed = true;
        }

        if (!consumed && *begin == '\'') {
            end = apprun_string_consume_until(begin + 1, single_quote_delimiter);
            strncat(buffer, begin + 1, end - begin - 1);
            consumed = true;

            end++;
        }

        if (!consumed && *begin == '\"') {
            end = apprun_string_consume_until(begin + 1, double_quote_delimiter);
            strncat(buffer, begin + 1, end - begin - 1);
            consumed = true;

            end++;
        }

        if (!consumed && *begin != '\'' && *begin != '\"' && *begin != '\\') {
            end = apprun_string_consume_until(begin, regular_quote_delimiter);
            strncat(buffer, begin, end - begin);
        }

        if (isspace(*end) || *end == 0) {
            if (!apprun_string_is_all_blanks(buffer)) {
                splits[split_count] = apprun_string_trim(buffer);
                split_count++;
            }

            memset(buffer, 0, 1024);
        }

        begin = end;
    }

    return splits;
}